

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionHelper.cpp
# Opt level: O0

bool Inferences::InductionHelper::isInductionForInfiniteIntervalsOn(void)

{
  bool bVar1;
  int iVar2;
  IntegerInductionInterval IVar3;
  byte local_19;
  bool local_11;
  
  if ((isInductionForInfiniteIntervalsOn()::infinite == '\0') &&
     (iVar2 = __cxa_guard_acquire(&isInductionForInfiniteIntervalsOn()::infinite), iVar2 != 0)) {
    IVar3 = Shell::Options::integerInductionInterval(Lib::env);
    local_11 = true;
    if (IVar3 != INFINITE) {
      IVar3 = Shell::Options::integerInductionInterval(Lib::env);
      local_11 = IVar3 == BOTH;
    }
    isInductionForInfiniteIntervalsOn::infinite = local_11;
    __cxa_guard_release(&isInductionForInfiniteIntervalsOn()::infinite);
  }
  bVar1 = isIntInductionOn();
  local_19 = 0;
  if (bVar1) {
    local_19 = isInductionForInfiniteIntervalsOn::infinite;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool InductionHelper::isInductionForInfiniteIntervalsOn() {
  static bool infinite = env.options->integerInductionInterval() == Options::IntegerInductionInterval::INFINITE ||
                         env.options->integerInductionInterval() == Options::IntegerInductionInterval::BOTH;
  return isIntInductionOn() && infinite;
}